

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O2

QMenu * __thiscall QScrollBar::createStandardContextMenu(QScrollBar *this,QPoint position)

{
  int iVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  QWidget *pQVar2;
  QWindow *pQVar3;
  QTLWExtra *pQVar4;
  QObject *ptr;
  QAction *pQVar5;
  undefined4 *puVar6;
  char *s;
  char *s_00;
  char *s_01;
  char *s_02;
  char *s_03;
  char *s_04;
  long in_FS_OFFSET;
  bool bVar7;
  QAnyStringView QVar8;
  QArrayDataPointer<char16_t> local_68;
  QObject local_50 [8];
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(*(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8 + 0x280);
  this_00.m_data = operator_new(0x28);
  QMenu::QMenu((QMenu *)this_00.m_data,(QWidget *)0x0);
  QVar8.m_size = (size_t)"qt_scrollbar_menu";
  QVar8.field_0.m_data = this_00.m_data;
  QObject::setObjectName(QVar8);
  pQVar2 = QWidget::window((QWidget *)this);
  if (pQVar2 != (QWidget *)0x0) {
    pQVar2 = QWidget::window((QWidget *)this);
    pQVar3 = QWidget::windowHandle(pQVar2);
    if (pQVar3 != (QWindow *)0x0) {
      pQVar4 = QWidgetPrivate::topData(*(QWidgetPrivate **)((long)this_00.m_data + 8));
      if (pQVar4 != (QTLWExtra *)0x0) {
        pQVar2 = QWidget::window((QWidget *)this);
        QWidget::windowHandle(pQVar2);
        ptr = (QObject *)QWindow::screen();
        QWeakPointer<QObject>::assign<QObject>(&(pQVar4->initialScreen).wp,ptr);
      }
    }
  }
  tr((QString *)&local_68,"Scroll here",(char *)0x0,-1);
  pQVar5 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar6 = (undefined4 *)operator_new(0x28);
  bVar7 = iVar1 == 1;
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:393:46),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar6 + 4) = this;
  *(bool *)(puVar6 + 6) = bVar7;
  *(QPoint *)(puVar6 + 7) = position;
  s_03 = "Top";
  if (bVar7) {
    s_03 = "Left edge";
  }
  s_04 = "Bottom";
  if (bVar7) {
    s_04 = "Right edge";
  }
  s = "Page up";
  if (bVar7) {
    s = "Page left";
  }
  s_00 = "Page down";
  if (bVar7) {
    s_00 = "Page right";
  }
  s_01 = "Scroll up";
  if (bVar7) {
    s_01 = "Scroll left";
  }
  s_02 = "Scroll down";
  if (bVar7) {
    s_02 = "Scroll right";
  }
  QObject::connectImpl
            (local_50,(void **)pQVar5,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QMenu::addSeparator((QMenu *)this_00.m_data);
  tr((QString *)&local_68,s_03,(char *)0x0,-1);
  pQVar5 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar6 = (undefined4 *)operator_new(0x18);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:397:64),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar6 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar5,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  tr((QString *)&local_68,s_04,(char *)0x0,-1);
  pQVar5 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar6 = (undefined4 *)operator_new(0x18);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:400:68),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar6 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar5,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QMenu::addSeparator((QMenu *)this_00.m_data);
  tr((QString *)&local_68,s,(char *)0x0,-1);
  pQVar5 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar6 = (undefined4 *)operator_new(0x18);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:404:68),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar6 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar5,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  tr((QString *)&local_68,s_00,(char *)0x0,-1);
  pQVar5 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar6 = (undefined4 *)operator_new(0x18);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:407:71),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar6 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar5,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QMenu::addSeparator((QMenu *)this_00.m_data);
  tr((QString *)&local_68,s_01,(char *)0x0,-1);
  pQVar5 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar6 = (undefined4 *)operator_new(0x18);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:411:72),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar6 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar5,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  tr((QString *)&local_68,s_02,(char *)0x0,-1);
  pQVar5 = QWidget::addAction((QWidget *)this_00.m_data,(QString *)&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar6 = (undefined4 *)operator_new(0x18);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:414:75),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar6 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar5,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QMenu *)this_00.m_data;
  }
  __stack_chk_fail();
}

Assistant:

QMenu *QScrollBar::createStandardContextMenu(QPoint position)
{
#if QT_CONFIG(menu)
    const bool horiz = HORIZONTAL;
    QMenu *menu = new QMenu();
    menu->setObjectName("qt_scrollbar_menu"_L1);

    if (window() && window()->windowHandle()) {
        if (auto *menuTopData = QMenuPrivate::get(menu)->topData())
            menuTopData->initialScreen = window()->windowHandle()->screen();
    }

    menu->addAction(tr("Scroll here"), this, [this, horiz, position] {
        setValue(d_func()->pixelPosToRangeValue(horiz ? position.x() : position.y()));
    });
    menu->addSeparator();
    menu->addAction(horiz ? tr("Left edge") : tr("Top"), this, [this] {
        triggerAction(QAbstractSlider::SliderToMinimum);
    });
    menu->addAction(horiz ? tr("Right edge") : tr("Bottom"), this, [this] {
        triggerAction(QAbstractSlider::SliderToMaximum);
    });
    menu->addSeparator();
    menu->addAction(horiz ? tr("Page left") : tr("Page up"), this, [this] {
        triggerAction(QAbstractSlider::SliderPageStepSub);
    });
    menu->addAction(horiz ? tr("Page right") : tr("Page down"), this, [this] {
        triggerAction(QAbstractSlider::SliderPageStepAdd);
    });
    menu->addSeparator();
    menu->addAction(horiz ? tr("Scroll left") : tr("Scroll up"), this, [this] {
        triggerAction(QAbstractSlider::SliderSingleStepSub);
    });
    menu->addAction(horiz ? tr("Scroll right") : tr("Scroll down"), this, [this] {
        triggerAction(QAbstractSlider::SliderSingleStepAdd);
    });
    return menu;
#else
    Q_UNUSED(position);
    return nullptr;
#endif // QT_CONFIG(menu)
}